

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O2

void anon_unknown.dwarf_10e1::mndl<Imf_3_2::Rgba>
               (Array2D<Imf_3_2::Rgba> *px,int w,int h,int xMin,int xMax,int yMin,int yMax,
               int xSamples,int ySamples,double rMin,double rMax,double iMin,double aspect,
               double rSeed,double iSeed)

{
  Rgba *pRVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int j;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  half *this;
  long lVar14;
  Rgba *this_00;
  half *this_01;
  float fVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float f;
  double dVar19;
  double local_118;
  
  if (5 < xSamples) {
    xSamples = 6;
  }
  iVar12 = 6;
  if (ySamples < 6) {
    iVar12 = ySamples;
  }
  f = (1.0 / (float)iVar12) * (1.0 / (float)xSamples);
  iVar13 = iVar12;
  if (iVar12 < 1) {
    iVar13 = 0;
  }
  iVar11 = xSamples;
  if (xSamples < 1) {
    iVar11 = 0;
  }
  for (lVar7 = (long)yMin; lVar7 < yMax; lVar7 = lVar7 + 1) {
    for (lVar10 = (long)xMin; lVar10 < xMax; lVar10 = lVar10 + 1) {
      lVar14 = px->_sizeY * (lVar7 - yMin);
      pRVar1 = px->_data;
      uVar8 = lVar10 - xMin;
      this_00 = pRVar1 + lVar14 + uVar8;
      Imath_3_2::half::operator=(&this_00->r,0.0);
      this_01 = &pRVar1[lVar14 + uVar8].g;
      Imath_3_2::half::operator=(this_01,0.0);
      this = &pRVar1[lVar14 + uVar8].b;
      Imath_3_2::half::operator=(this,0.0);
      lVar14 = lVar14 + uVar8;
      local_118 = 0.0;
      for (iVar6 = 0; iVar6 != iVar11; iVar6 = iVar6 + 1) {
        dVar16 = 0.0;
        for (iVar9 = 0; iVar9 != iVar13; iVar9 = iVar9 + 1) {
          uVar5 = 0;
          dVar19 = 0.0;
          dVar3 = iSeed;
          dVar4 = rSeed;
          while ((uVar5 < 0x100 && (dVar19 < 100.0))) {
            dVar19 = dVar4 * dVar4 - dVar3 * dVar3;
            dVar3 = dVar3 * (dVar4 + dVar4) +
                    (dVar16 * (double)(1.0 / (float)iVar12) + (double)(int)lVar7) *
                    ((((aspect * (rMax - rMin) * (double)h) / (double)w + iMin) - iMin) / (double)h)
                    + iMin;
            dVar4 = (local_118 * (double)(1.0 / (float)xSamples) + (double)(int)lVar10) *
                    ((rMax - rMin) / (double)w) + rMin + dVar19;
            uVar5 = uVar5 + 1;
          }
          Imath_3_2::half::operator=(&pRVar1[lVar14].a,(float)(int)uVar5 * 0.00390625);
          fVar15 = (float)(int)uVar5 * 0.00390625 * 4.0;
          fVar17 = (fVar15 + 0.33333) - (float)(int)(fVar15 + 0.33333);
          fVar17 = fVar17 + fVar17;
          fVar18 = (fVar15 - (float)(int)fVar15) + (fVar15 - (float)(int)fVar15);
          auVar2._4_4_ = -(uint)(fVar17 < 1.0);
          auVar2._0_4_ = -(uint)(fVar17 < 1.0);
          auVar2._8_4_ = -(uint)(fVar18 < 1.0);
          auVar2._12_4_ = -(uint)(fVar18 < 1.0);
          uVar5 = movmskpd((int)uVar8,auVar2);
          uVar8 = (ulong)uVar5;
          if ((uVar5 & 2) == 0) {
            fVar18 = 2.0 - fVar18;
          }
          Imath_3_2::half::operator+=(&this_00->r,fVar18 * 4.0 + 0.1);
          if ((uVar5 & 1) == 0) {
            fVar17 = 2.0 - fVar17;
          }
          Imath_3_2::half::operator+=(this_01,fVar17 * 4.0 + 0.1);
          fVar15 = (fVar15 + 0.66667) - (float)(int)(fVar15 + 0.66667);
          fVar15 = fVar15 + fVar15;
          Imath_3_2::half::operator+=
                    (this,(float)(~-(uint)(fVar15 < 1.0) & (uint)(2.0 - fVar15) |
                                 (uint)fVar15 & -(uint)(fVar15 < 1.0)) * 4.0 + 0.1);
          dVar16 = dVar16 + 1.0;
        }
        local_118 = local_118 + 1.0;
      }
      Imath_3_2::half::operator*=(&this_00->r,f);
      Imath_3_2::half::operator*=(this_01,f);
      Imath_3_2::half::operator*=(this,f);
      Imath_3_2::half::operator*=(&pRVar1[lVar14].a,f);
    }
  }
  return;
}

Assistant:

void
mndl (
    Array2D<P>& px,
    int         w,
    int         h,
    int         xMin,
    int         xMax,
    int         yMin,
    int         yMax,
    int         xSamples,
    int         ySamples,
    double      rMin,
    double      rMax,
    double      iMin,
    double      aspect,
    double      rSeed,
    double      iSeed)
{
    if (xSamples > 6) xSamples = 6;

    if (ySamples > 6) ySamples = 6;

    double iMax = iMin + aspect * (rMax - rMin) * h / w;
    double sx   = double (rMax - rMin) / w;
    double sy   = double (iMax - iMin) / h;
    double tx   = 1.f / xSamples;
    double ty   = 1.f / ySamples;
    float  t    = tx * ty;

    for (int y = yMin; y < yMax; ++y)
    {
        for (int x = xMin; x < xMax; ++x)
        {
            P& p = px[y - yMin][x - xMin];

            clear (p);

            for (int i = 0; i < xSamples; ++i)
            {
                for (int j = 0; j < ySamples; ++j)
                {
                    const double a    = rMin + sx * (x + i * tx);
                    const double b    = iMin + sy * (y + j * ty);
                    const double sMax = 100;
                    const int    kMax = 256;
                    double       r    = rSeed;
                    double       i    = iSeed;
                    double       s    = 0;
                    int          k    = 0;

                    while (k < kMax && s < sMax)
                    {
                        s = r * r - i * i;
                        i = 2 * r * i + b;
                        r = s + a;
                        k++;
                    }

                    add (k / float (kMax), p);
                }
            }

            scale (t, p);
        }
    }
}